

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O2

TranslatorInfo * __thiscall
helics::TranslatorFederate::getTranslatorInfo(TranslatorFederate *this,GlobalHandle gid)

{
  TranslatorInfo *pTVar1;
  GlobalHandle local_8;
  
  local_8 = gid;
  pTVar1 = gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::find
                     (&this->translators,&local_8);
  return pTVar1;
}

Assistant:

TranslatorInfo* TranslatorFederate::getTranslatorInfo(GlobalHandle gid)
{
    return translators.find(gid);
}